

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * EnvironmentTypeToStr_abi_cxx11_
                   (string *__return_storage_ptr__,EnvironmentType environmentType)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(environmentType) {
  case ENV_TYPE_2D:
    __s = "2d";
    __a = &local_9;
    break;
  case ENV_TYPE_2DUU:
    __s = "2duu";
    __a = &local_a;
    break;
  case ENV_TYPE_XYTHETA:
    __s = "xytheta";
    __a = &local_b;
    break;
  case ENV_TYPE_XYTHETAMLEV:
    __s = "xythetamlev";
    __a = &local_c;
    break;
  case ENV_TYPE_ROBARM:
    __s = "robarm";
    __a = &local_d;
    break;
  default:
    __s = "invalid";
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string EnvironmentTypeToStr(EnvironmentType environmentType)
{
    switch (environmentType) {
    case ENV_TYPE_2D:
        return std::string("2d");
    case ENV_TYPE_2DUU:
        return std::string("2duu");
    case ENV_TYPE_XYTHETA:
        return std::string("xytheta");
    case ENV_TYPE_XYTHETAMLEV:
        return std::string("xythetamlev");
    case ENV_TYPE_ROBARM:
        return std::string("robarm");
    default:
        return std::string("invalid");
    }
}